

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_trace(sqlite3 *db,_func_void_void_ptr_char_ptr *xTrace,void *pArg)

{
  void *pvVar1;
  undefined1 uVar2;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  void *pOld;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x14c334);
  pvVar1 = *(void **)(in_RDI + 0xf8);
  uVar2 = 0;
  if (in_RSI != 0) {
    uVar2 = 0x40;
  }
  *(undefined1 *)(in_RDI + 0x6e) = uVar2;
  *(long *)(in_RDI + 0xf0) = in_RSI;
  *(undefined8 *)(in_RDI + 0xf8) = in_RDX;
  sqlite3_mutex_leave((sqlite3_mutex *)0x14c392);
  return pvVar1;
}

Assistant:

SQLITE_API void *sqlite3_trace(sqlite3 *db, void(*xTrace)(void*,const char*), void *pArg){
  void *pOld;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  pOld = db->pTraceArg;
  db->mTrace = xTrace ? SQLITE_TRACE_LEGACY : 0;
  db->trace.xLegacy = xTrace;
  db->pTraceArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return pOld;
}